

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char et_getdigit(longdouble *val,int *cnt)

{
  longdouble d;
  int digit;
  int *cnt_local;
  longdouble *val_local;
  
  if (*cnt < 1) {
    val_local._7_1_ = '0';
  }
  else {
    *cnt = *cnt + -1;
    val_local._7_1_ = (char)(int)ROUND(*val) + '0';
    *val = (longdouble)10.0 * (*val - (longdouble)(int)ROUND(*val));
  }
  return val_local._7_1_;
}

Assistant:

static char et_getdigit(LONGDOUBLE_TYPE *val, int *cnt){
  int digit;
  LONGDOUBLE_TYPE d;
  if( (*cnt)<=0 ) return '0';
  (*cnt)--;
  digit = (int)*val;
  d = digit;
  digit += '0';
  *val = (*val - d)*10.0;
  return (char)digit;
}